

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileGate.cpp
# Opt level: O1

bool __thiscall TileGate::updateNextState(TileGate *this)

{
  Direction DVar1;
  State SVar2;
  int iVar3;
  State SVar4;
  Vector2u *pVVar5;
  Board *pBVar6;
  Tile *pTVar7;
  int i;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint numInputs;
  int numMiddle;
  State adjacentStates [4];
  State local_38 [4];
  Vector2u local_28;
  
  pVVar5 = Tile::getPosition(&this->super_Tile);
  iVar3 = 0;
  local_38[0] = DISCONNECTED;
  if (pVVar5->y != 0) {
    pBVar6 = Tile::getBoardPtr(&this->super_Tile);
    pVVar5 = Tile::getPosition(&this->super_Tile);
    uVar9 = pVVar5->x;
    pVVar5 = Tile::getPosition(&this->super_Tile);
    local_28.y = pVVar5->y - 1;
    local_28.x = uVar9;
    pTVar7 = Board::getTile(pBVar6,&local_28);
    local_38[0] = (*pTVar7->_vptr_Tile[7])(pTVar7,0);
  }
  pVVar5 = Tile::getPosition(&this->super_Tile);
  uVar9 = pVVar5->x;
  pBVar6 = Tile::getBoardPtr(&this->super_Tile);
  pVVar5 = Board::getSize(pBVar6);
  if (uVar9 < pVVar5->x - 1) {
    pBVar6 = Tile::getBoardPtr(&this->super_Tile);
    pVVar5 = Tile::getPosition(&this->super_Tile);
    uVar9 = pVVar5->x;
    pVVar5 = Tile::getPosition(&this->super_Tile);
    local_28.y = pVVar5->y;
    local_28.x = uVar9 + 1;
    pTVar7 = Board::getTile(pBVar6,&local_28);
    iVar3 = (*pTVar7->_vptr_Tile[7])(pTVar7,1);
  }
  local_38[1] = iVar3;
  pVVar5 = Tile::getPosition(&this->super_Tile);
  uVar9 = pVVar5->y;
  pBVar6 = Tile::getBoardPtr(&this->super_Tile);
  pVVar5 = Board::getSize(pBVar6);
  iVar3 = 0;
  local_38[2] = 0;
  if (uVar9 < pVVar5->y - 1) {
    pBVar6 = Tile::getBoardPtr(&this->super_Tile);
    pVVar5 = Tile::getPosition(&this->super_Tile);
    uVar9 = pVVar5->x;
    pVVar5 = Tile::getPosition(&this->super_Tile);
    local_28.y = pVVar5->y + 1;
    local_28.x = uVar9;
    pTVar7 = Board::getTile(pBVar6,&local_28);
    local_38[2] = (*pTVar7->_vptr_Tile[7])(pTVar7,2);
  }
  pVVar5 = Tile::getPosition(&this->super_Tile);
  if (pVVar5->x != 0) {
    pBVar6 = Tile::getBoardPtr(&this->super_Tile);
    pVVar5 = Tile::getPosition(&this->super_Tile);
    uVar9 = pVVar5->x;
    pVVar5 = Tile::getPosition(&this->super_Tile);
    local_28.y = pVVar5->y;
    local_28.x = uVar9 - 1;
    pTVar7 = Board::getTile(pBVar6,&local_28);
    iVar3 = (*pTVar7->_vptr_Tile[7])(pTVar7,3);
  }
  local_38[3] = iVar3;
  uVar8 = 0;
  iVar3 = 0;
  uVar9 = 0;
  numInputs = 0;
  do {
    if (((this->super_Tile)._direction != uVar8) && (SVar4 = local_38[uVar8], SVar4 != DISCONNECTED)
       ) {
      numInputs = numInputs + 1;
      if (SVar4 == MIDDLE) {
        iVar3 = iVar3 + 1;
      }
      else if (SVar4 == HIGH) {
        uVar9 = uVar9 + 1;
      }
    }
    uVar8 = uVar8 + 1;
  } while (uVar8 != 4);
  numMiddle = 0;
  if (Board::enableExtraLogicStates != false) {
    numMiddle = iVar3;
  }
  if (this->_connectorChange != false) {
    DVar1 = (this->super_Tile)._direction;
    iVar3 = *(int *)&(this->super_Tile).field_0x24;
    uVar10 = DVar1 + 4;
    if (-1 < (int)(DVar1 + EAST)) {
      uVar10 = DVar1 + EAST;
    }
    SVar4 = local_38[(int)((DVar1 - (uVar10 & 0xfffffffc)) + 1)];
    this->_rightConnector = SVar4 != DISCONNECTED;
    uVar10 = DVar1 + 6;
    if (-1 < (int)(DVar1 + WEST)) {
      uVar10 = DVar1 + WEST;
    }
    SVar2 = local_38[(int)((DVar1 - (uVar10 & 0xfffffffc)) + 3)];
    this->_leftConnector = SVar2 != DISCONNECTED;
    if (((iVar3 < 3) && (SVar4 != DISCONNECTED)) && (SVar2 != DISCONNECTED)) {
      this->_rightConnector = false;
      this->_leftConnector = false;
    }
    this->_connectorChange = false;
    (*(this->super_Tile)._vptr_Tile[8])(this,1,0);
  }
  switch(*(undefined4 *)&(this->super_Tile).field_0x24) {
  case 0:
    if (numInputs == 1) {
      if (uVar9 == 1) {
        this->_nextState = HIGH;
        goto switchD_0013a4fa_default;
      }
      if (numMiddle == 1) {
        this->_nextState = MIDDLE;
        goto switchD_0013a4fa_default;
      }
    }
    this->_nextState = LOW;
    goto switchD_0013a4fa_default;
  case 1:
    SVar4 = _findNextStateBuffer(this,local_38,numInputs,uVar9,numMiddle);
    goto LAB_0013a642;
  case 2:
    SVar4 = _findNextStateBuffer(this,local_38,numInputs,uVar9,numMiddle);
    break;
  case 3:
    if ((1 < (int)numInputs) &&
       ((SVar4 = HIGH, uVar9 == numInputs || (SVar4 = MIDDLE, numMiddle + uVar9 == numInputs))))
    goto LAB_0013a642;
    goto LAB_0013a636;
  case 4:
    if (((int)numInputs < 2) ||
       ((SVar4 = HIGH, uVar9 != numInputs && (SVar4 = MIDDLE, numMiddle + uVar9 != numInputs)))) {
LAB_0013a627:
      SVar4 = LOW;
    }
    break;
  case 5:
    if (((int)numInputs < 2) || ((SVar4 = HIGH, (int)uVar9 < 1 && (SVar4 = MIDDLE, numMiddle < 1))))
    goto LAB_0013a636;
    goto LAB_0013a642;
  case 6:
    if (((int)numInputs < 2) || ((SVar4 = HIGH, (int)uVar9 < 1 && (SVar4 = MIDDLE, numMiddle < 1))))
    goto LAB_0013a627;
    break;
  case 7:
    if (((int)numInputs < 2) ||
       ((SVar4 = MIDDLE, numMiddle == 0 && (SVar4 = HIGH, (uVar9 & 0x80000001) != 1))))
    goto LAB_0013a636;
    goto LAB_0013a642;
  case 8:
    if (((int)numInputs < 2) ||
       ((SVar4 = MIDDLE, numMiddle == 0 && (SVar4 = HIGH, (uVar9 & 0x80000001) != 1))))
    goto LAB_0013a627;
    break;
  default:
    goto switchD_0013a4fa_default;
  }
  if (SVar4 == LOW) {
    SVar4 = HIGH;
  }
  else if (SVar4 == HIGH) {
LAB_0013a636:
    SVar4 = LOW;
  }
LAB_0013a642:
  this->_nextState = SVar4;
switchD_0013a4fa_default:
  return this->_nextState != this->_state;
}

Assistant:

bool TileGate::updateNextState() {
    State adjacentStates[4];
    adjacentStates[0] = getPosition().y > 0 ? getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y - 1))->checkOutput(NORTH) : DISCONNECTED;
    adjacentStates[1] = getPosition().x < getBoardPtr()->getSize().x - 1 ? getBoardPtr()->getTile(Vector2u(getPosition().x + 1, getPosition().y))->checkOutput(EAST) : DISCONNECTED;
    adjacentStates[2] = getPosition().y < getBoardPtr()->getSize().y - 1 ? getBoardPtr()->getTile(Vector2u(getPosition().x, getPosition().y + 1))->checkOutput(SOUTH) : DISCONNECTED;
    adjacentStates[3] = getPosition().x > 0 ? getBoardPtr()->getTile(Vector2u(getPosition().x - 1, getPosition().y))->checkOutput(WEST) : DISCONNECTED;
    
    int numInputs = 0, numHigh = 0, numMiddle = 0;
    for (int i = 0; i < 4; ++i) {
        if (i != _direction && adjacentStates[i] != DISCONNECTED) {
            ++numInputs;
            if (adjacentStates[i] == HIGH) {
                ++numHigh;
            } else if (adjacentStates[i] == MIDDLE) {
                ++numMiddle;
            }
        }
    }
    if (!Board::enableExtraLogicStates) {
        numMiddle = 0;
    }
    if (_connectorChange) {
        _rightConnector = (adjacentStates[(_direction + 1) % 4] != DISCONNECTED);
        _leftConnector = (adjacentStates[(_direction + 3) % 4] != DISCONNECTED);
        if (_type < AND && _rightConnector && _leftConnector) {
            _rightConnector = false;
            _leftConnector = false;
        }
        _connectorChange = false;
        addUpdate(true);
    }
    
    if (_type == DIODE) {
        if (numInputs == 1) {
            if (numHigh == 1) {
                _nextState = HIGH;
            } else if (numMiddle == 1) {
                _nextState = MIDDLE;
            } else {
                _nextState = LOW;
            }
        } else {
            _nextState = LOW;
        }
    } else if (_type == BUFFER) {
        _nextState = _findNextStateBuffer(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NOT) {
        _nextState = _complementState(_findNextStateBuffer(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == AND) {
        _nextState = _findNextStateAND(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NAND) {
        _nextState = _complementState(_findNextStateAND(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == OR) {
        _nextState = _findNextStateOR(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == NOR) {
        _nextState = _complementState(_findNextStateOR(adjacentStates, numInputs, numHigh, numMiddle));
    } else if (_type == XOR) {
        _nextState = _findNextStateXOR(adjacentStates, numInputs, numHigh, numMiddle);
    } else if (_type == XNOR) {
        _nextState = _complementState(_findNextStateXOR(adjacentStates, numInputs, numHigh, numMiddle));
    }
    
    //cout << "Gate at (" << getPosition().x << ", " << getPosition().y << ") checked for state change:" << endl;
    //cout << "  aS = [" << adjacentStates[0] << ", " << adjacentStates[1] << ", " << adjacentStates[2] << ", " << adjacentStates[3] << "]" << endl;
    //cout << "  state = " << _state << ", next = " << _nextState << endl;
    
    return _nextState != _state;
}